

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,prevector<8u,int,unsigned_int,int>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          prevector<8U,_int,_unsigned_int,_int> *v)

{
  long lVar1;
  bool bVar2;
  const_iterator in_RDX;
  DataStream *in_RSI;
  long in_FS_OFFSET;
  value_type_conflict2 *elem;
  prevector<8U,_int,_unsigned_int,_int> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffb0;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<8U,_int,_unsigned_int,_int>::size(in_stack_ffffffffffffffb8);
  WriteCompactSize<DataStream>
            ((DataStream *)in_stack_ffffffffffffffb8,(uint64_t)in_stack_ffffffffffffffb0);
  prevector<8U,_int,_unsigned_int,_int>::begin(in_stack_ffffffffffffffb0);
  prevector<8U,_int,_unsigned_int,_int>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar2 = prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffffb0,in_RDX);
    if (!bVar2) break;
    in_stack_ffffffffffffffb0 =
         (prevector<8U,_int,_unsigned_int,_int> *)
         prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator*((const_iterator *)in_RSI);
    DefaultFormatter::Ser<DataStream,int>(in_RSI,(int *)0x92824a);
    prevector<8U,_int,_unsigned_int,_int>::const_iterator::operator++((const_iterator *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }